

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int archive_write_mtree_header(archive_write *a,archive_entry *entry)

{
  mtree_writer *mtree_00;
  mode_t mVar1;
  int iVar2;
  uint64_t uVar3;
  archive_entry *in_RSI;
  long in_RDI;
  int r2;
  int r;
  mtree_entry_conflict *mtree_entry;
  mtree_writer *mtree;
  mtree_entry_conflict **in_stack_00000038;
  archive_entry *in_stack_00000040;
  archive_write *in_stack_00000048;
  mtree_entry_conflict **in_stack_00000120;
  archive_write *in_stack_00000128;
  void *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  mtree_entry_conflict *local_28;
  int local_4;
  
  mtree_00 = *(mtree_writer **)(in_RDI + 0xd0);
  if (mtree_00->first != 0) {
    mtree_00->first = 0;
    archive_strcat((archive_string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
    if ((mtree_00->keys & 0x380238U) == 0) {
      mtree_00->output_global_set = 0;
    }
  }
  uVar3 = archive_entry_size(in_RSI);
  mtree_00->entry_bytes_remaining = uVar3;
  if ((mtree_00->dironly == 0) || (mVar1 = archive_entry_filetype(in_RSI), mVar1 == 0x4000)) {
    local_4 = mtree_entry_new(in_stack_00000048,in_stack_00000040,in_stack_00000038);
    if (-0x15 < local_4) {
      iVar2 = mtree_entry_tree_add(in_stack_00000128,in_stack_00000120);
      if (iVar2 < -0x14) {
        mtree_entry_free((mtree_entry_conflict *)0x2acfd0);
        local_4 = iVar2;
      }
      else {
        mtree_00->mtree_entry = local_28;
        if (local_28->reg_info != (reg_info *)0x0) {
          sum_init(mtree_00);
        }
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
archive_write_mtree_header(struct archive_write *a,
    struct archive_entry *entry)
{
	struct mtree_writer *mtree= a->format_data;
	struct mtree_entry *mtree_entry;
	int r, r2;

	if (mtree->first) {
		mtree->first = 0;
		archive_strcat(&mtree->buf, "#mtree\n");
		if ((mtree->keys & SET_KEYS) == 0)
			mtree->output_global_set = 0;/* Disabled. */
	}

	mtree->entry_bytes_remaining = archive_entry_size(entry);

	/* While directory only mode, we do not handle non directory files. */
	if (mtree->dironly && archive_entry_filetype(entry) != AE_IFDIR)
		return (ARCHIVE_OK);

	r2 = mtree_entry_new(a, entry, &mtree_entry);
	if (r2 < ARCHIVE_WARN)
		return (r2);
	r = mtree_entry_tree_add(a, &mtree_entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(mtree_entry);
		return (r);
	}
	mtree->mtree_entry = mtree_entry;

	/* If the current file is a regular file, we have to
	 * compute the sum of its content.
	 * Initialize a bunch of sum check context. */
	if (mtree_entry->reg_info)
		sum_init(mtree);

	return (r2);
}